

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall CTcPrsOpAsi::parse(CTcPrsOpAsi *this)

{
  uint uVar1;
  tc_toktyp_t tVar2;
  int iVar3;
  CTcPrsNode *pCVar4;
  char *pcVar5;
  undefined4 extraout_var;
  CTcPrsNode *pCVar6;
  undefined **ppuVar7;
  
  pCVar4 = CTcPrsOpIf::parse((CTcPrsOpIf *)this);
  if (pCVar4 != (CTcPrsNode *)0x0) {
    tVar2 = (G_tok->curtok_).typ_;
    uVar1 = tVar2 - TOKT_PLUSEQ;
    if ((10 < uVar1) && (tVar2 != this->asi_op_)) {
      return pCVar4;
    }
    iVar3 = (*(pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[3])(pCVar4);
    if (iVar3 == 0) {
      pcVar5 = CTcTokenizer::get_op_text((G_tok->curtok_).typ_);
      CTcTokenizer::log_error(0x2afc,pcVar5);
    }
    CTcTokenizer::next(G_tok);
    iVar3 = (**(this->super_CTcPrsOp)._vptr_CTcPrsOp)(this);
    if ((_func_int **)CONCAT44(extraout_var,iVar3) != (_func_int **)0x0) {
      pCVar6 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x18);
      (pCVar6->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
           (_func_int **)&PTR___cxa_pure_virtual_0035bc70;
      pCVar6[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar4;
      pCVar6[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           (_func_int **)CONCAT44(extraout_var,iVar3);
      if (uVar1 < 0xb) {
        ppuVar7 = (undefined **)(&PTR_PTR_0035b720)[uVar1];
      }
      else {
        ppuVar7 = &PTR_gen_code_00361ab0;
      }
      (pCVar6->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)ppuVar7;
      return pCVar6;
    }
  }
  return (CTcPrsNode *)0x0;
}

Assistant:

CTcPrsNode *CTcPrsOpAsi::parse() const
{
    /* start by parsing a conditional subexpression */
    CTcPrsNode *lhs = S_op_if.parse();
    if (lhs == 0)
        return 0;

    /* get the next operator */
    tc_toktyp_t curtyp = G_tok->cur();

    /* check to see if it's an assignment operator of some kind */
    switch(curtyp)
    {
    case TOKT_PLUSEQ:
    case TOKT_MINEQ:
    case TOKT_TIMESEQ:
    case TOKT_DIVEQ:
    case TOKT_MODEQ:
    case TOKT_ANDEQ:
    case TOKT_OREQ:
    case TOKT_XOREQ:
    case TOKT_SHLEQ:
    case TOKT_ASHREQ:
    case TOKT_LSHREQ:
        /* it's an assignment operator - process it */
        break;
        
    default:
        /* check against the current simple-assignment operator */
        if (curtyp == asi_op_)
        {
            /* it's an assignment operator - process it */
            break;
        }
        else
        {
            /* 
             *   it's not an assignment - return the original
             *   subexpression with no further elaboration 
             */
            return lhs;
        }
    }

    /* check for a valid lvalue */
    if (!lhs->check_lvalue())
    {
        /* log an error but continue parsing */
        G_tok->log_error(TCERR_INVALID_LVALUE,
                         G_tok->get_op_text(G_tok->cur()));
    }

    /* skip the assignment operator */
    G_tok->next();
    
    /* 
     *   Recursively parse an assignment subexpression.  Do this
     *   recursively rather than iteratively, because assignment operators
     *   group right-to-left.  By recursively parsing an assignment, our
     *   right-hand side will contain all remaining assignment expressions
     *   incorporated into it.  
     */
    CTcPrsNode *rhs = parse();
    if (rhs == 0)
        return 0;

    /* build and return the result based on the operator type */
    switch(curtyp)
    {
    case TOKT_PLUSEQ:
        lhs = new CTPNAddAsi(lhs, rhs);
        break;
        
    case TOKT_MINEQ:
        lhs = new CTPNSubAsi(lhs, rhs);
        break;
        
    case TOKT_TIMESEQ:
        lhs = new CTPNMulAsi(lhs, rhs);
        break;

    case TOKT_DIVEQ:
        lhs = new CTPNDivAsi(lhs, rhs);
        break;

    case TOKT_MODEQ:
        lhs = new CTPNModAsi(lhs, rhs);
        break;

    case TOKT_ANDEQ:
        lhs = new CTPNBAndAsi(lhs, rhs);
        break;

    case TOKT_OREQ:
        lhs = new CTPNBOrAsi(lhs, rhs);
        break;

    case TOKT_XOREQ:
        lhs = new CTPNBXorAsi(lhs, rhs);
        break;

    case TOKT_SHLEQ:
        lhs = new CTPNShlAsi(lhs, rhs);
        break;

    case TOKT_ASHREQ:
        lhs = new CTPNAShrAsi(lhs, rhs);
        break;

    case TOKT_LSHREQ:
        lhs = new CTPNLShrAsi(lhs, rhs);
        break;

    default:
        /* plain assignment operator */
        lhs = new CTPNAsi(lhs, rhs);
        break;
    }

    /* return the result */
    return lhs;
}